

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_format.hpp
# Opt level: O2

string_t *
cfgfile::from_cfgfile_format<cfgfile::qstring_trait_t>
          (string_t *__return_storage_ptr__,string_t *what)

{
  char16_t cVar1;
  int iVar2;
  int iVar3;
  exception_t<cfgfile::qstring_trait_t> *peVar4;
  long lVar5;
  allocator<char> local_11a;
  allocator<char> local_119;
  string_t tmp;
  string local_100;
  string_t local_e0;
  string local_c8;
  string_t local_a8;
  QString local_90;
  string_t local_78;
  qstring_wrapper_t local_60;
  qstring_wrapper_t local_48;
  
  iVar2 = qstring_wrapper_t::find(what,const_t<cfgfile::qstring_trait_t>::c_quotes);
  if (iVar2 == 0) {
    iVar3 = qstring_wrapper_t::rfind(what,const_t<cfgfile::qstring_trait_t>::c_quotes);
    iVar2 = (int)(what->m_str).d.size;
    if (iVar3 == iVar2 + -1) {
      qstring_wrapper_t::substr(&tmp,what,1,iVar2 + -2);
      (__return_storage_ptr__->m_str).d.d = (Data *)0x0;
      (__return_storage_ptr__->m_str).d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->m_str).d.size = 0;
      iVar2 = 0;
      do {
        if ((int)tmp.m_str.d.size <= iVar2) {
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tmp);
          return __return_storage_ptr__;
        }
        lVar5 = (long)iVar2;
        if (tmp.m_str.d.ptr[lVar5] == const_t<cfgfile::qstring_trait_t>::c_back_slash) {
          iVar2 = iVar2 + 1;
          if ((int)tmp.m_str.d.size <= iVar2) {
            peVar4 = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_100,"Unfinished backslash sequence \"\\\".",
                       (allocator<char> *)&local_c8);
            qstring_trait_t::from_ascii(&local_e0,&local_100);
            exception_t<cfgfile::qstring_trait_t>::exception_t(peVar4,&local_e0);
            __cxa_throw(peVar4,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                        exception_t<cfgfile::qstring_trait_t>::~exception_t);
          }
          cVar1 = tmp.m_str.d.ptr[iVar2];
          if ((((cVar1 != const_t<cfgfile::qstring_trait_t>::c_quotes.ucs) &&
               (cVar1 != const_t<cfgfile::qstring_trait_t>::c_n)) &&
              (cVar1 != const_t<cfgfile::qstring_trait_t>::c_r)) &&
             ((cVar1 != const_t<cfgfile::qstring_trait_t>::c_t && (cVar1 != tmp.m_str.d.ptr[lVar5]))
             )) {
            peVar4 = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_100,"Unrecognized backslash sequence \"\\",&local_119);
            qstring_trait_t::from_ascii(&local_78,&local_100);
            QString::QString(&local_90,1,(QChar)tmp.m_str.d.ptr[iVar2]);
            operator+(&local_60,&local_78,(qstring_wrapper_t *)&local_90);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"\".",&local_11a)
            ;
            qstring_trait_t::from_ascii(&local_a8,&local_c8);
            operator+(&local_48,&local_60,&local_a8);
            exception_t<cfgfile::qstring_trait_t>::exception_t(peVar4,&local_48);
            __cxa_throw(peVar4,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                        exception_t<cfgfile::qstring_trait_t>::~exception_t);
          }
          QString::append((QChar)(char16_t)__return_storage_ptr__);
        }
        else {
          QString::append((QChar)(char16_t)__return_storage_ptr__);
        }
        iVar2 = iVar2 + 1;
      } while( true );
    }
  }
  QArrayDataPointer<char16_t>::QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)__return_storage_ptr__,
             (QArrayDataPointer<char16_t> *)what);
  return __return_storage_ptr__;
}

Assistant:

static inline typename Trait::string_t from_cfgfile_format(
	const typename Trait::string_t & what )
{
	if( what.find( const_t< Trait >::c_quotes ) == 0 &&
		what.rfind( const_t< Trait >::c_quotes ) == what.length() - 1 )
	{
		typename Trait::string_t tmp = what.substr( 1, what.length() - 2 );

		typename Trait::string_t result;

		for( typename Trait::string_t::size_type i = 0; i < tmp.length(); ++i )
		{
			if( tmp.at( i ) == const_t< Trait >::c_back_slash )
			{
				if( i + 1 < tmp.length() )
				{
					if( tmp.at( i + 1 ) == const_t< Trait >::c_quotes )
						result.push_back( const_t< Trait >::c_quotes );
					else if( tmp.at( i + 1 ) == const_t< Trait >::c_n )
						result.push_back( const_t< Trait >::c_carriage_return );
					else if( tmp.at( i + 1 ) == const_t< Trait >::c_r )
						result.push_back( const_t< Trait >::c_line_feed );
					else if( tmp.at( i + 1 ) == const_t< Trait >::c_t )
						result.push_back( const_t< Trait >::c_tab );
					else if( tmp.at( i + 1 ) == const_t< Trait >::c_back_slash )
						result.push_back( const_t< Trait >::c_back_slash );
					else
						throw exception_t< Trait > ( Trait::from_ascii(
								"Unrecognized backslash sequence \"\\" ) +
							typename Trait::string_t( 1, tmp.at( i + 1 ) ) +
							Trait::from_ascii( "\"." ) );

					++i;
				}
				else
					throw exception_t< Trait > ( Trait::from_ascii(
						"Unfinished backslash sequence \"\\\"." ) );
			}
			else
				result.push_back( tmp.at( i ) );
		}

		return result;
	}
	else
		return what;
}